

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryMap.cpp
# Opt level: O3

error<idx2::mmap_err_code> idx2::OpenFile(mmap_file *MMap,cstr Name,map_mode Mode)

{
  long lVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  char *pcVar5;
  long *in_FS_OFFSET;
  error<idx2::mmap_err_code> eVar6;
  
  iVar2 = 0x242;
  if (Mode == Read) {
    iVar2 = 0;
  }
  iVar2 = open(Name,iVar2,0x180);
  MMap->File = iVar2;
  if (iVar2 == -1) {
    *(char **)(*in_FS_OFFSET + -0x480) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/MemoryMap.cpp"
    ;
    *(undefined4 *)(*in_FS_OFFSET + -0x280) = 0x1a;
    lVar4 = 0x10;
    do {
      if (*(int *)((long)&mmap_err_code_s::NameMap.Arr[0].Name.field_0 + lVar4) == 10) {
        iVar2 = 10;
        goto LAB_0019d0b6;
      }
      lVar4 = lVar4 + 0x18;
    } while (lVar4 != 0x298);
    iVar2 = 0x1b;
LAB_0019d0b6:
    lVar4 = 0x10;
    while (*(int *)((long)&mmap_err_code_s::NameMap.Arr[0].Name.field_0 + lVar4) != iVar2) {
      lVar4 = lVar4 + 0x18;
      if (lVar4 == 0x298) {
        __assert_fail("It != End(EnumS.NameMap)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/MemoryMap.h"
                      ,0x28,"stref idx2::ToString(mmap_err_code)");
      }
    }
    lVar1 = *in_FS_OFFSET;
    iVar2 = snprintf((char *)(lVar1 + -0xc80),0x400,"%.*s (file %s, line %d): ",
                     (ulong)*(uint *)(&err_code_s::NameMap + lVar4),
                     *(undefined8 *)(&err_code_s::NameMap.Len + lVar4),
                     "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/MemoryMap.cpp"
                     ,0x1a);
    pcVar5 = "file: %s\n";
    snprintf((char *)(lVar1 + -0xc80) + iVar2,0x400 - (long)iVar2,"file: %s\n",Name);
    uVar3 = 0x1000000000a;
  }
  else {
    MMap->Mode = Mode;
    *(char **)(*in_FS_OFFSET + -0x480) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/MemoryMap.cpp"
    ;
    *(undefined4 *)(*in_FS_OFFSET + -0x280) = 0x1d;
    pcVar5 = "";
    uVar3 = 0;
  }
  eVar6.Code = (int)uVar3;
  eVar6.StackIdx = (char)((ulong)uVar3 >> 0x20);
  eVar6.StrGened = (bool)(char)((ulong)uVar3 >> 0x28);
  eVar6._14_2_ = (short)((ulong)uVar3 >> 0x30);
  eVar6.Msg = pcVar5;
  return eVar6;
}

Assistant:

error<mmap_err_code>
OpenFile(mmap_file* MMap, cstr Name, map_mode Mode)
{
#if defined(_WIN32)
  MMap->File = CreateFileA(Name,
                           Mode == map_mode::Read ? GENERIC_READ : GENERIC_READ | GENERIC_WRITE,
                           0,
                           NULL,
                           OPEN_ALWAYS,
                           FILE_ATTRIBUTE_NORMAL,
                           NULL);
  if (MMap->File == INVALID_HANDLE_VALUE)
    return idx2_Error(mmap_err_code::FileCreateFailed, "file: %s\n", Name);
#elif defined(__CYGWIN__) || defined(__linux__) || defined(__APPLE__)
  MMap->File = open(Name, Mode == map_mode::Read ? O_RDONLY : O_RDWR | O_CREAT | O_TRUNC, 0600);
  if (MMap->File == -1)
    return idx2_Error(mmap_err_code::FileCreateFailed, "file: %s\n", Name);
#endif
  MMap->Mode = Mode;
  return idx2_Error(mmap_err_code::NoError);
}